

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_message.cc
# Opt level: O0

int google::protobuf::compiler::objectivec::anon_unknown_7::OrderGroupForFieldDescriptor
              (FieldDescriptor *descriptor)

{
  bool bVar1;
  Type TVar2;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  LogMessage *this;
  undefined8 in_stack_ffffffffffffff98;
  LogLevel level;
  FieldDescriptor *in_stack_ffffffffffffffa0;
  LogMessage local_48;
  int local_4;
  
  level = (LogLevel)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x55a493);
  if (bVar1) {
    local_4 = 3;
  }
  else {
    TVar2 = FieldDescriptor::type(in_stack_ffffffffffffffa0);
    switch((LogMessage *)(ulong)(TVar2 - TYPE_DOUBLE)) {
    case (LogMessage *)0x0:
    case (LogMessage *)0x2:
    case (LogMessage *)0x3:
    case (LogMessage *)0x5:
    case (LogMessage *)0xf:
    case (LogMessage *)0x11:
      local_4 = 4;
      break;
    case (LogMessage *)0x1:
    case (LogMessage *)0x4:
    case (LogMessage *)0x6:
    case (LogMessage *)0xc:
    case (LogMessage *)0xd:
    case (LogMessage *)0xe:
    case (LogMessage *)0x10:
      local_4 = 2;
      break;
    case (LogMessage *)0x7:
      local_4 = 99;
      break;
    case (LogMessage *)0x8:
    case (LogMessage *)0x9:
    case (LogMessage *)0xa:
    case (LogMessage *)0xb:
      local_4 = 3;
      break;
    default:
      this = &local_48;
      internal::LogMessage::LogMessage
                ((LogMessage *)(ulong)(TVar2 - TYPE_DOUBLE),level,(char *)this,
                 in_stack_ffffffffffffff8c);
      internal::LogMessage::operator<<
                (this,(char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      internal::LogFinisher::operator=
                ((LogFinisher *)this,
                 (LogMessage *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      internal::LogMessage::~LogMessage((LogMessage *)0x55a557);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int OrderGroupForFieldDescriptor(const FieldDescriptor* descriptor) {
  // The first item in the object structure is our uint32[] for has bits.
  // We then want to order things to make the instances as small as
  // possible. So we follow the has bits with:
  //   1. Anything always 4 bytes - float, *32, enums
  //   2. Anything that is always a pointer (they will be 8 bytes on 64 bit
  //      builds and 4 bytes on 32bit builds.
  //   3. Anything always 8 bytes - double, *64
  //
  // NOTE: Bools aren't listed, they were stored in the has bits.
  //
  // Why? Using 64bit builds as an example, this means worse case, we have
  // enough bools that we overflow 1 byte from 4 byte alignment, so 3 bytes
  // are wasted before the 4 byte values. Then if we have an odd number of
  // those 4 byte values, the 8 byte values will be pushed down by 32bits to
  // keep them aligned. But the structure will end 8 byte aligned, so no
  // waste on the end. If you did the reverse order, you could waste 4 bytes
  // before the first 8 byte value (after the has array), then a single
  // bool on the end would need 7 bytes of padding to make the overall
  // structure 8 byte aligned; so 11 bytes, wasted total.

  // Anything repeated is a GPB*Array/NSArray, so pointer.
  if (descriptor->is_repeated()) {
    return 3;
  }

  switch (descriptor->type()) {
    // All always 8 bytes.
    case FieldDescriptor::TYPE_DOUBLE:
    case FieldDescriptor::TYPE_INT64:
    case FieldDescriptor::TYPE_SINT64:
    case FieldDescriptor::TYPE_UINT64:
    case FieldDescriptor::TYPE_SFIXED64:
    case FieldDescriptor::TYPE_FIXED64:
      return 4;

    // Pointers (string and bytes are NSString and NSData); 8 or 4 bytes
    // depending on the build architecture.
    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_BYTES:
      return 3;

    // All always 4 bytes (enums are int32s).
    case FieldDescriptor::TYPE_FLOAT:
    case FieldDescriptor::TYPE_INT32:
    case FieldDescriptor::TYPE_SINT32:
    case FieldDescriptor::TYPE_UINT32:
    case FieldDescriptor::TYPE_SFIXED32:
    case FieldDescriptor::TYPE_FIXED32:
    case FieldDescriptor::TYPE_ENUM:
      return 2;

    // 0 bytes. Stored in the has bits.
    case FieldDescriptor::TYPE_BOOL:
      return 99;  // End of the list (doesn't really matter).
  }

  // Some compilers report reaching end of function even though all cases of
  // the enum are handed in the switch.
  GOOGLE_LOG(FATAL) << "Can't get here.";
  return 0;
}